

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManMarkFanoutDrivers(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pGStack_18 = *(ulong *)pGStack_18 & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsAnd(pGStack_18);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_18);
      if (iVar1 != 0) {
        pGVar2 = Gia_ObjFanin0(pGStack_18);
        *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      }
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGStack_18);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      pGVar2 = Gia_ObjFanin1(pGStack_18);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Gia_ManMarkFanoutDrivers( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
}